

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::clearImage
          (ShaderRenderCaseInstance *this,Sampler *refSampler,deUint32 mipLevels,
          deUint32 arrayLayers,VkImage destImage)

{
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)6>_> data_01;
  deUint32 queueFamilyIndex_00;
  int iVar1;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk_00;
  VkQueue pVVar3;
  Handle<(vk::HandleType)24> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)6> *pHVar6;
  undefined8 uStack_2b8;
  VkSubmitInfo submitInfo;
  int local_25c [2];
  VkImageSubresourceRange clearRange;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  RefData<vk::Handle<(vk::HandleType)6>_> local_178;
  deUint64 local_158;
  Move<vk::VkCommandBuffer_s_*> local_150;
  RefData<vk::VkCommandBuffer_s_*> local_130;
  Move<vk::Handle<(vk::HandleType)24>_> local_110;
  RefData<vk::Handle<(vk::HandleType)24>_> local_f0;
  undefined1 local_d0 [8];
  VkClearValue clearValue;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  undefined1 local_90 [8];
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkImageAspectFlags aspectMask;
  bool isShadowSampler;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *vk;
  VkDevice vkDevice;
  deUint32 arrayLayers_local;
  deUint32 mipLevels_local;
  Sampler *refSampler_local;
  ShaderRenderCaseInstance *this_local;
  VkImage destImage_local;
  
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar3 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  iVar1 = (refSampler->compare != COMPAREMODE_NONE) + 1;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move((Move<vk::VkCommandBuffer_s_*> *)local_90);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)((long)&clearValue + 8));
  ::deMemset(local_d0,0,0x10);
  ::vk::createCommandPool
            (&local_110,vk_00,device,1,queueFamilyIndex_00,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f0,(Move *)&local_110);
  data.deleter.m_deviceIface._0_4_ = (int)local_f0.deleter.m_deviceIface;
  data.object.m_internal = local_f0.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f0.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_f0.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_f0.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_110);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                      &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  local_158 = pHVar4->m_internal;
  ::vk::allocateCommandBuffer
            (&local_150,vk_00,device,(VkCommandPool)local_158,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_130.deleter.m_deviceIface;
  data_00.object = local_130.object;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_130.deleter.m_device;
  data_00.deleter.m_pool.m_internal._0_4_ = (int)local_130.deleter.m_pool.m_internal;
  data_00.deleter.m_pool.m_internal._4_4_ = (int)(local_130.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=
            ((Move<vk::VkCommandBuffer_s_*> *)local_90,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_150);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)
                    &preImageBarrier.subresourceRange.layerCount,vk_00,device,0,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_178,(Move *)&preImageBarrier.subresourceRange.layerCount);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_178.deleter.m_deviceIface;
  data_01.object.m_internal = local_178.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_178.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_178.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_178.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_178.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)6>_> *)((long)&clearValue + 8),data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&preImageBarrier.subresourceRange.layerCount);
  postImageBarrier.subresourceRange.layerCount = 0x2d;
  preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  preImageBarrier._4_4_ = 0;
  preImageBarrier.pNext._0_4_ = 0;
  preImageBarrier.pNext._4_4_ = 0x1000;
  preImageBarrier.srcAccessMask = 0;
  preImageBarrier.dstAccessMask = 7;
  preImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  preImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  preImageBarrier.image.m_internal._4_4_ = 0;
  preImageBarrier.subresourceRange.baseMipLevel = 0;
  cmdBufferBeginInfo.pInheritanceInfo._0_4_ = 0x2d;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext._0_4_ = 0x1000;
  postImageBarrier.pNext._4_4_ = 0x20;
  postImageBarrier.srcAccessMask = 7;
  postImageBarrier.dstAccessMask = 5;
  postImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.image.m_internal._4_4_ = 0;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  cmdBufferBeginInfo.pNext = (void *)0x1;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  clearRange.baseArrayLayer = 0x2a;
  clearRange.layerCount = 0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  local_25c[1] = 0;
  clearRange.baseMipLevel = 0;
  local_25c[0] = iVar1;
  clearRange.aspectMask = mipLevels;
  clearRange.levelCount = arrayLayers;
  postImageBarrier._32_8_ = destImage.m_internal;
  postImageBarrier.image.m_internal._0_4_ = iVar1;
  postImageBarrier.subresourceRange.aspectMask = mipLevels;
  postImageBarrier.subresourceRange.levelCount = arrayLayers;
  preImageBarrier._32_8_ = destImage.m_internal;
  preImageBarrier.image.m_internal._0_4_ = iVar1;
  preImageBarrier.subresourceRange.aspectMask = mipLevels;
  preImageBarrier.subresourceRange.levelCount = arrayLayers;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar5,&clearRange.baseArrayLayer);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x523);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar5,0x4000,0x1000,0,0,0,0,0,1,&postImageBarrier.subresourceRange.layerCount)
  ;
  if (iVar1 == 1) {
    ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
    (*vk_00->_vptr_DeviceInterface[0x66])
              (vk_00,*ppVVar5,destImage.m_internal,7,local_d0,1,local_25c);
  }
  else {
    ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
    submitInfo.pSignalSemaphores = (VkSemaphore *)destImage.m_internal;
    (*vk_00->_vptr_DeviceInterface[0x67])
              (vk_00,*ppVVar5,destImage.m_internal,7,local_d0,1,local_25c);
  }
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar5,0x1000,1,0,0,0,0,0,1,&cmdBufferBeginInfo.pInheritanceInfo);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar5);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x52e);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_2b8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)((long)&clearValue + 8));
  VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_2b8,pHVar6->m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x53d);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)((long)&clearValue + 8));
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar6,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x53e);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)((long)&clearValue + 8));
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move((Move<vk::VkCommandBuffer_s_*> *)local_90);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  return;
}

Assistant:

void ShaderRenderCaseInstance::clearImage (const tcu::Sampler&					refSampler,
										   deUint32								mipLevels,
										   deUint32								arrayLayers,
										   VkImage								destImage)
{
	const VkDevice					vkDevice				= m_context.getDevice();
	const DeviceInterface&			vk						= m_context.getDeviceInterface();
	const VkQueue					queue					= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const bool						isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	Move<VkCommandPool>				cmdPool;
	Move<VkCommandBuffer>			cmdBuffer;
	Move<VkFence>					fence;

	VkClearValue					clearValue;
	deMemset(&clearValue, 0, sizeof(clearValue));


	// Create command pool and buffer
	cmdPool		= createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);
	cmdBuffer	= allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	fence = createFence(vk, vkDevice);

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};


	const VkImageSubresourceRange clearRange		=
	{
		aspectMask,										// VkImageAspectFlags	aspectMask;
		0u,												// deUint32				baseMipLevel;
		mipLevels,										// deUint32				levelCount;
		0u,												// deUint32				baseArrayLayer;
		arrayLayers										// deUint32				layerCount;
	};

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &preImageBarrier);
	if (aspectMask == VK_IMAGE_ASPECT_COLOR_BIT)
	{
		vk.cmdClearColorImage(*cmdBuffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearValue.color, 1, &clearRange);
	}
	else
	{
		vk.cmdClearDepthStencilImage(*cmdBuffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearValue.depthStencil, 1, &clearRange);
	}
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// deUint32						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// deUint32						commandBufferCount;
		&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
		0u,								// deUint32						signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
}